

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O3

void __thiscall internalJSONNode::Set(internalJSONNode *this,bool val)

{
  byte extraout_AL;
  byte extraout_AL_00;
  undefined7 in_register_00000031;
  undefined1 *puVar1;
  
  this->_type = '\x03';
  (this->_value)._bool = val;
  if ((int)CONCAT71(in_register_00000031,val) == 0) {
    if (jsonSingletonCONST_FALSE::getValue[abi:cxx11]()::single != '\0') goto LAB_001170f8;
    Set();
    if ((extraout_AL_00 & 1) != 0) goto LAB_001170f8;
    puVar1 = &jsonSingletonCONST_FALSE::getValue[abi:cxx11]()::single;
  }
  else {
    if (jsonSingletonCONST_TRUE::getValue[abi:cxx11]()::single != '\0') goto LAB_001170f8;
    Set();
    if ((extraout_AL & 1) != 0) goto LAB_001170f8;
    puVar1 = &jsonSingletonCONST_TRUE::getValue[abi:cxx11]()::single;
  }
  __cxa_guard_release(puVar1);
LAB_001170f8:
  std::__cxx11::string::_M_assign((string *)&this->_string);
  this->fetched = true;
  return;
}

Assistant:

void internalJSONNode::Set(bool val) json_nothrow {
    makeNotContainer();
    _type = JSON_BOOL;
    _value._bool = val;
    #if(defined(JSON_CASTABLE) || !defined(JSON_LESS_MEMORY) || defined(JSON_WRITE_PRIORITY))
	   _string = val ? json_global(CONST_TRUE) : json_global(CONST_FALSE);
    #endif
    SetFetched(true);
}